

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

void on_upgrade_complete(void *_conn,h2o_socket_t *sock,size_t reqsize)

{
  ulong uVar1;
  h2o_http2_stream_t *stream;
  size_t min_guarantee;
  h2o_buffer_t **_inbuf;
  long *in_FS_OFFSET;
  
  if (sock == (h2o_socket_t *)0x0) {
    close_connection((h2o_http2_conn_t *)_conn);
    return;
  }
  *(h2o_socket_t **)((long)_conn + 0x30) = sock;
  sock->data = _conn;
  *(h2o_buffer_t **)((long)_conn + 200) = sock->input;
  sock->input = (h2o_buffer_t *)(*in_FS_OFFSET + 0x18);
  h2o_socket_read_start(*(h2o_socket_t **)((long)_conn + 0x30),on_read);
  stream = h2o_http2_conn_get_stream((h2o_http2_conn_t *)_conn,1);
  execute_or_enqueue_request((h2o_http2_conn_t *)_conn,stream);
  uVar1 = *(ulong *)(*(long *)((long)_conn + 200) + 8);
  min_guarantee = uVar1 - reqsize;
  if (reqsize <= uVar1 && min_guarantee != 0) {
    _inbuf = &sock->input;
    h2o_buffer_reserve(_inbuf,min_guarantee);
    memcpy((*_inbuf)->bytes,(void *)(reqsize + *(long *)(*(long *)((long)_conn + 200) + 0x10)),
           min_guarantee);
    (*_inbuf)->size = (*_inbuf)->size + min_guarantee;
    on_read(*(h2o_socket_t **)((long)_conn + 0x30),(char *)0x0);
    return;
  }
  return;
}

Assistant:

static void on_upgrade_complete(void *_conn, h2o_socket_t *sock, size_t reqsize)
{
    h2o_http2_conn_t *conn = _conn;

    if (sock == NULL) {
        close_connection(conn);
        return;
    }

    conn->sock = sock;
    sock->data = conn;
    conn->_http1_req_input = sock->input;
    h2o_buffer_init(&sock->input, &h2o_socket_buffer_prototype);

    /* setup inbound */
    h2o_socket_read_start(conn->sock, on_read);

    /* handle the request */
    execute_or_enqueue_request(conn, h2o_http2_conn_get_stream(conn, 1));

    if (conn->_http1_req_input->size > reqsize) {
        size_t remaining_bytes = conn->_http1_req_input->size - reqsize;
        h2o_buffer_reserve(&sock->input, remaining_bytes);
        memcpy(sock->input->bytes, conn->_http1_req_input->bytes + reqsize, remaining_bytes);
        sock->input->size += remaining_bytes;
        on_read(conn->sock, NULL);
    }
}